

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::runPassOnFunction(PassRunner *this,Pass *pass,Function *func)

{
  string *__k;
  undefined1 *o;
  undefined8 __p;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  Fatal *this_00;
  undefined8 unaff_R13;
  ulong uVar5;
  stringstream local_388 [8];
  stringstream bodyBefore;
  ostream local_378 [376];
  undefined1 local_200 [392];
  string local_78 [36];
  uint local_54;
  _Head_base<0UL,_wasm::AfterEffectFunctionChecker_*,_false> local_50;
  unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
  checker;
  char local_39;
  Function *local_38;
  Function *func_local;
  
  local_38 = func;
  iVar2 = (*pass->_vptr_Pass[4])(pass);
  if ((char)iVar2 == '\0') {
    __assert_fail("pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x3d2,"void wasm::PassRunner::runPassOnFunction(Pass *, Function *)");
  }
  __k = &pass->name;
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->options).passesToSkip._M_h,__k);
  if (sVar3 != 0) {
    std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->skippedPasses,__k);
    return;
  }
  iVar2 = getPassDebug();
  if ((iVar2 == 2) && ((this->options).validate == true)) {
    uVar5 = CONCAT71((int7)((ulong)unaff_R13 >> 8),(pass->name)._M_string_length != 0);
  }
  else {
    uVar5 = 0;
  }
  std::__cxx11::stringstream::stringstream(local_388);
  if ((char)uVar5 != '\0') {
    poVar4 = std::operator<<(local_378,local_38->body);
    std::operator<<(poVar4,'\n');
  }
  local_50._M_head_impl = (AfterEffectFunctionChecker *)0x0;
  if (iVar2 != 0) {
    local_54 = (uint)uVar5;
    std::make_unique<wasm::AfterEffectFunctionChecker,wasm::Function*&>((Function **)local_200);
    __p = local_200._0_8_;
    local_200._0_8_ =
         (__uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
          )0x0;
    std::
    __uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
    ::reset((__uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
             *)&local_50,(pointer)__p);
    std::
    unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
    ::~unique_ptr((unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                   *)local_200);
    uVar5 = (ulong)local_54;
  }
  (*pass->_vptr_Pass[5])(&checker,pass);
  Pass::setPassRunner((Pass *)checker._M_t.
                              super___uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::AfterEffectFunctionChecker_*,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                              .super__Head_base<0UL,_wasm::AfterEffectFunctionChecker_*,_false>.
                              _M_head_impl,this);
  (**(code **)(*(long *)checker._M_t.
                        super___uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::AfterEffectFunctionChecker_*,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                        .super__Head_base<0UL,_wasm::AfterEffectFunctionChecker_*,_false>.
                        _M_head_impl + 0x18))
            (checker._M_t.
             super___uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::AfterEffectFunctionChecker_*,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
             .super__Head_base<0UL,_wasm::AfterEffectFunctionChecker_*,_false>._M_head_impl,
             this->wasm,local_38);
  handleAfterEffects(this,pass,local_38);
  if (iVar2 != 0) {
    AfterEffectFunctionChecker::check(local_50._M_head_impl);
  }
  if ((char)uVar5 != '\0') {
    bVar1 = WasmValidator::validate((WasmValidator *)local_200,local_38,this->wasm,0);
    if (!bVar1) {
      Fatal::Fatal((Fatal *)local_200);
      poVar4 = (ostream *)(local_200 + 0x10);
      std::operator<<(poVar4,"Last nested function-parallel pass (");
      std::operator<<(poVar4,(string *)__k);
      std::operator<<(poVar4,") broke validation of function ");
      this_00 = Fatal::operator<<((Fatal *)local_200,(Name *)local_38);
      o = &this_00->field_0x10;
      std::operator<<((ostream *)o,". Here is the function body before:\n");
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)o,local_78);
      std::operator<<((ostream *)o,"\n\nAnd here it is now:\n");
      std::operator<<((ostream *)o,local_38->body);
      local_39 = '\n';
      Fatal::operator<<(this_00,&local_39);
      std::__cxx11::string::~string(local_78);
      Fatal::~Fatal((Fatal *)local_200);
    }
  }
  if ((__uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
       )checker._M_t.
        super___uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::AfterEffectFunctionChecker_*,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
        .super__Head_base<0UL,_wasm::AfterEffectFunctionChecker_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
       )0x0) {
    (**(code **)(*(long *)checker._M_t.
                          super___uniq_ptr_impl<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::AfterEffectFunctionChecker_*,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                          .super__Head_base<0UL,_wasm::AfterEffectFunctionChecker_*,_false>.
                          _M_head_impl + 8))();
  }
  std::
  unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
  ::~unique_ptr((unique_ptr<wasm::AfterEffectFunctionChecker,_std::default_delete<wasm::AfterEffectFunctionChecker>_>
                 *)&local_50);
  std::__cxx11::stringstream::~stringstream(local_388);
  return;
}

Assistant:

void PassRunner::runPassOnFunction(Pass* pass, Function* func) {
  assert(pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    skippedPasses.insert(pass->name);
    return;
  }

  auto passDebug = getPassDebug();

  // Add extra validation logic in pass-debug mode 2. The main logic in
  // PassRunner::run will work at the module level, and here for a function-
  // parallel pass we can do the same at the function level: we can print the
  // function before the pass, run the pass on the function, and then if it
  // fails to validate we can show an error and print the state right before the
  // pass broke it.
  //
  // Skip nameless passes for this. Anything without a name is an internal
  // component of some larger pass, and information about it won't be very
  // useful - leave it to the entire module to fail validation in that case.
  bool extraFunctionValidation =
    passDebug == 2 && options.validate && !pass->name.empty();
  std::stringstream bodyBefore;
  if (extraFunctionValidation) {
    bodyBefore << *func->body << '\n';
  }

  std::unique_ptr<AfterEffectFunctionChecker> checker;
  if (passDebug) {
    checker = std::make_unique<AfterEffectFunctionChecker>(func);
  }

  // Function-parallel passes get a new instance per function
  auto instance = pass->create();
  instance->setPassRunner(this);
  instance->runOnFunction(wasm, func);
  handleAfterEffects(pass, func);

  if (passDebug) {
    checker->check();
  }

  if (extraFunctionValidation) {
    if (!WasmValidator().validate(func, *wasm, WasmValidator::Minimal)) {
      Fatal() << "Last nested function-parallel pass (" << pass->name
              << ") broke validation of function " << func->name
              << ". Here is the function body before:\n"
              << bodyBefore.str() << "\n\nAnd here it is now:\n"
              << *func->body << '\n';
    }
  }
}